

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_draw_pal.cpp
# Opt level: O3

void __thiscall
swrenderer::DrawFogBoundaryLinePalCommand::Execute
          (DrawFogBoundaryLinePalCommand *this,DrawerThread *thread)

{
  int iVar1;
  uint8_t *puVar2;
  uint8_t *puVar3;
  long lVar4;
  
  iVar1 = *(int *)&(this->super_PalSpanCommand).field_0x64;
  if (((thread->pass_start_y <= iVar1) && (iVar1 < thread->pass_end_y)) &&
     (iVar1 % thread->num_cores == thread->core)) {
    puVar2 = this->_colormap;
    iVar1 = (&ylookup)[iVar1];
    puVar3 = this->_destorg;
    lVar4 = (long)this->x1 + -1;
    do {
      puVar3[lVar4 + (long)iVar1 + 1] = puVar2[puVar3[lVar4 + (long)iVar1 + 1]];
      lVar4 = lVar4 + 1;
    } while (lVar4 < this->x2);
  }
  return;
}

Assistant:

void DrawFogBoundaryLinePalCommand::Execute(DrawerThread *thread)
	{
		if (thread->line_skipped_by_thread(y))
			return;

		const uint8_t *colormap = _colormap;
		uint8_t *dest = ylookup[y] + _destorg;
		int x = x1;
		do
		{
			dest[x] = colormap[dest[x]];
		} while (++x <= x2);
	}